

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint _c;
  size_t _elemsize;
  uint uVar3;
  void *pvVar4;
  int i;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int k;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int _w;
  int iVar20;
  float fVar21;
  int local_124;
  Mat bottom_blob_bordered;
  Mat m;
  Mat local_88;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar9 = bottom_blob->w;
  iVar19 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar8 = (ulong)_c;
  _elemsize = bottom_blob->elemsize;
  if (this->global_pooling != 0) {
    Mat::create(top_blob,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar18 = iVar19 * iVar9;
    if (this->pooling_type == 1) {
      uVar3 = uVar18;
      if ((int)uVar18 < 1) {
        uVar3 = 0;
      }
      if ((int)_c < 1) {
        uVar8 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar11);
        pvVar4 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar21 = 0.0;
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          fVar21 = fVar21 + *(float *)((long)pvVar4 + uVar6 * 4);
        }
        *(float *)((long)top_blob->data + uVar11 * 4) = fVar21 * (1.0 / (float)(int)uVar18);
      }
      return 0;
    }
    if (this->pooling_type != 0) {
      return 0;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    if ((int)_c < 1) {
      uVar8 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar11);
      pvVar4 = bottom_blob_bordered.data;
      Mat::~Mat(&bottom_blob_bordered);
      fVar21 = *pvVar4;
      for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
        fVar2 = *(float *)((long)pvVar4 + uVar6 * 4);
        if (fVar21 <= fVar2) {
          fVar21 = fVar2;
        }
      }
      *(float *)((long)top_blob->data + uVar11 * 4) = fVar21;
    }
    return 0;
  }
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  if (this->pooling_type == 0) {
    fVar21 = -3.4028235e+38;
  }
  else {
    fVar21 = 0.0;
  }
  iVar13 = this->pad_mode;
  iVar20 = 0;
  if (iVar13 == 2) {
    iVar5 = ~((iVar9 + -1) % this->stride_w) + this->kernel_w;
    iVar13 = ~((iVar19 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar5) || (iVar9 = bottom_blob_bordered.w, iVar19 = bottom_blob_bordered.h, 0 < iVar13)
       ) {
      copy_make_border(bottom_blob,&bottom_blob_bordered,iVar13 / 2,iVar13 - iVar13 / 2,iVar5 / 2,
                       iVar5 - iVar5 / 2,0,fVar21,opt->workspace_allocator,opt->num_threads);
      goto LAB_0011057e;
    }
LAB_001105aa:
    local_124 = 0;
  }
  else {
    if (iVar13 == 1) {
      copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom,
                       this->pad_left,this->pad_right,0,fVar21,opt->workspace_allocator,
                       opt->num_threads);
LAB_0011057e:
      iVar13 = -100;
      if ((bottom_blob_bordered.data == (void *)0x0) ||
         (iVar9 = bottom_blob_bordered.w, iVar19 = bottom_blob_bordered.h,
         (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_00110cf3;
      goto LAB_001105aa;
    }
    if (iVar13 != 0) goto LAB_001105aa;
    iVar13 = ((iVar9 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar9 = ((iVar19 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
    local_124 = this->stride_w - iVar13;
    if (iVar13 == 0) {
      local_124 = 0;
    }
    iVar20 = this->stride_h - iVar9;
    if (iVar9 == 0) {
      iVar20 = 0;
    }
    copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom + iVar20,
                     this->pad_left,this->pad_right + local_124,0,fVar21,opt->workspace_allocator,
                     opt->num_threads);
    iVar13 = -100;
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar9 = bottom_blob_bordered.w, iVar19 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_00110cf3;
  }
  iVar5 = (iVar9 - this->kernel_w) / this->stride_w;
  iVar19 = (iVar19 - this->kernel_h) / this->stride_h;
  _w = iVar5 + 1;
  Mat::create(top_blob,_w,iVar19 + 1,_c,_elemsize,opt->blob_allocator);
  iVar13 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar11 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar11,(allocator_type *)&m);
    iVar13 = this->kernel_w;
    iVar9 = iVar9 - iVar13;
    lVar7 = 0;
    iVar10 = 0;
    for (iVar14 = 0; iVar14 < this->kernel_h; iVar14 = iVar14 + 1) {
      for (lVar16 = 0; iVar15 = (int)lVar16, iVar15 < iVar13; lVar16 = lVar16 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar7 + lVar16] = iVar10 + iVar15;
        iVar13 = this->kernel_w;
      }
      iVar10 = iVar10 + iVar9 + iVar15;
      lVar7 = (int)lVar7 + lVar16;
    }
    lVar7 = (long)iVar5;
    iVar9 = (int)uVar11;
    if (this->pooling_type == 0) {
      uVar6 = 0;
      uVar11 = uVar11 & 0xffffffff;
      if (iVar9 < 1) {
        uVar11 = uVar6;
      }
      if ((int)_c < 1) {
        uVar8 = uVar6;
      }
      for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        m.data = (void *)(bottom_blob_bordered.cstep * uVar6 * bottom_blob_bordered.elemsize +
                         (long)bottom_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.elemsize = bottom_blob_bordered.elemsize;
        m.allocator = bottom_blob_bordered.allocator;
        m.dims = 2;
        m.w = bottom_blob_bordered.w;
        m.h = bottom_blob_bordered.h;
        m.c = 1;
        m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
        Mat::channel(&local_88,top_blob,(int)uVar6);
        pfVar12 = (float *)local_88.data;
        Mat::~Mat(&local_88);
        for (iVar9 = 0; iVar9 <= iVar19; iVar9 = iVar9 + 1) {
          iVar13 = this->stride_h;
          iVar20 = this->stride_w;
          for (lVar16 = 0; lVar16 <= lVar7; lVar16 = lVar16 + 1) {
            pfVar1 = (float *)((long)m.data +
                              lVar16 * iVar20 * 4 + (long)m.w * (long)iVar9 * (long)iVar13 * 4);
            fVar21 = *pfVar1;
            for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
              fVar2 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar17]];
              if (fVar21 <= fVar2) {
                fVar21 = fVar2;
              }
            }
            pfVar12[lVar16] = fVar21;
          }
          pfVar12 = pfVar12 + _w;
        }
        Mat::~Mat(&m);
      }
    }
    else if (this->pooling_type == 1) {
      uVar6 = 0;
      uVar11 = uVar11 & 0xffffffff;
      if (iVar9 < 1) {
        uVar11 = uVar6;
      }
      if ((int)_c < 1) {
        uVar8 = uVar6;
      }
      local_50 = lVar7 * 4;
      for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        m.data = (void *)(bottom_blob_bordered.cstep * uVar6 * bottom_blob_bordered.elemsize +
                         (long)bottom_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.elemsize = bottom_blob_bordered.elemsize;
        m.allocator = bottom_blob_bordered.allocator;
        m.dims = 2;
        m.w = bottom_blob_bordered.w;
        m.h = bottom_blob_bordered.h;
        m.c = 1;
        m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
        iVar5 = (int)uVar6;
        Mat::channel(&local_88,top_blob,iVar5);
        pfVar12 = (float *)local_88.data;
        Mat::~Mat(&local_88);
        for (iVar13 = 0; iVar13 <= iVar19; iVar13 = iVar13 + 1) {
          iVar10 = this->stride_h;
          iVar14 = this->stride_w;
          for (lVar16 = 0; lVar16 <= lVar7; lVar16 = lVar16 + 1) {
            fVar21 = 0.0;
            for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
              fVar21 = fVar21 + *(float *)((long)m.data +
                                          (long)_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar17] * 4
                                          + lVar16 * iVar14 * 4 +
                                            (long)m.w * (long)iVar13 * (long)iVar10 * 4);
            }
            pfVar12[lVar16] = fVar21 * (1.0 / (float)iVar9);
          }
          pfVar12 = pfVar12 + _w;
        }
        iVar13 = this->pad_top;
        if (iVar13 != 0) {
          iVar10 = this->kernel_h;
          Mat::channel(&local_88,top_blob,iVar5);
          pvVar4 = local_88.data;
          Mat::~Mat(&local_88);
          for (lVar16 = 0; lVar16 <= lVar7; lVar16 = lVar16 + 1) {
            *(float *)((long)pvVar4 + lVar16 * 4) =
                 *(float *)((long)pvVar4 + lVar16 * 4) * (float)iVar10 *
                 (1.0 / (float)(iVar10 - iVar13));
          }
        }
        iVar13 = this->pad_bottom;
        if (iVar13 != -iVar20) {
          iVar10 = this->kernel_h;
          Mat::channel(&local_88,top_blob,iVar5);
          pvVar4 = local_88.data;
          iVar14 = local_88.w * iVar19;
          Mat::~Mat(&local_88);
          for (lVar16 = 0; lVar16 <= lVar7; lVar16 = lVar16 + 1) {
            *(float *)((long)pvVar4 + (iVar14 + lVar16) * 4) =
                 *(float *)((long)pvVar4 + (iVar14 + lVar16) * 4) * (float)iVar10 *
                 (1.0 / (float)(iVar10 - (iVar13 + iVar20)));
          }
        }
        iVar13 = this->pad_left;
        if (iVar13 != 0) {
          iVar10 = this->kernel_w;
          Mat::channel(&local_88,top_blob,iVar5);
          pfVar12 = (float *)local_88.data;
          Mat::~Mat(&local_88);
          for (iVar14 = 0; iVar14 <= iVar19; iVar14 = iVar14 + 1) {
            *pfVar12 = *pfVar12 * (float)iVar10 * (1.0 / (float)(iVar10 - iVar13));
            pfVar12 = pfVar12 + lVar7 + 1;
          }
        }
        iVar13 = this->pad_right;
        if (iVar13 != -local_124) {
          iVar10 = this->kernel_w;
          Mat::channel(&local_88,top_blob,iVar5);
          pfVar12 = (float *)((long)local_88.data + local_50);
          Mat::~Mat(&local_88);
          for (iVar5 = 0; iVar5 <= iVar19; iVar5 = iVar5 + 1) {
            *pfVar12 = *pfVar12 * (float)iVar10 * (1.0 / (float)(iVar10 - (iVar13 + local_124)));
            pfVar12 = pfVar12 + lVar7 + 1;
          }
        }
        Mat::~Mat(&m);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    iVar13 = 0;
  }
LAB_00110cf3:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar13;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}